

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

int __thiscall IlmThread_2_5::ThreadPool::numThreads(ThreadPool *this)

{
  int iVar1;
  ThreadPoolProvider *pTVar2;
  undefined4 in_stack_ffffffffffffffc0;
  Data *in_stack_ffffffffffffffe0;
  
  Data::getProvider(in_stack_ffffffffffffffe0);
  pTVar2 = Data::SafeProvider::operator->((SafeProvider *)0x109e0b);
  iVar1 = (*pTVar2->_vptr_ThreadPoolProvider[2])();
  Data::SafeProvider::~SafeProvider((SafeProvider *)CONCAT44(iVar1,in_stack_ffffffffffffffc0));
  return iVar1;
}

Assistant:

int
ThreadPool::numThreads () const
{
    return _data->getProvider ()->numThreads ();
}